

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_equals_Test<std::pair<char32_t,_char8_t>_>::TestBody
          (UnicodeFullTest_equals_Test<std::pair<char32_t,_char8_t>_> *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*in_string_00) [5];
  char32_t (*in_string_01) [5];
  char32_t (*in_string_02) [5];
  char32_t (*in_string_03) [5];
  char32_t (*in_string_04) [5];
  char32_t (*in_string_05) [5];
  char32_t (*in_string_06) [5];
  char32_t (*in_string_07) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  AssertHelper local_2a8 [8];
  Message local_2a0 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_298;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_278;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_220 [8];
  Message local_218 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_210;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_1f0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_198 [8];
  Message local_190 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_188;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_168;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_110 [8];
  Message local_108 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_100;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_e0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88 [8];
  Message local_80 [24];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_48;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  UnicodeFullTest_equals_Test<std::pair<char32_t,_char8_t>_> *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  jessilib::string_cast<char32_t,char32_t[5]>(&local_48,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_68,(jessilib *)L"ABCD",in_string);
  local_21 = jessilib::equals<char32_t,char8_t>(&local_48,&local_68);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::u8string::~u8string((u8string *)&local_68);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_20,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_e0,(jessilib *)L"abcd",in_string_00);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_100,(jessilib *)L"abcd",in_string_01);
  local_b9 = jessilib::equals<char32_t,char8_t>(&local_e0,&local_100);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::__cxx11::u8string::~u8string((u8string *)&local_100);
  std::__cxx11::u32string::~u32string((u32string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_b8,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_168,(jessilib *)L"ABCD",in_string_02);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_188,(jessilib *)L"abcd",in_string_03);
  bVar1 = jessilib::equals<char32_t,char8_t>(&local_168,&local_188);
  local_141 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  std::__cxx11::u8string::~u8string((u8string *)&local_188);
  std::__cxx11::u32string::~u32string((u32string *)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_140,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_1f0,(jessilib *)L"abcd",in_string_04);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_210,(jessilib *)L"ABCD",in_string_05);
  bVar1 = jessilib::equals<char32_t,char8_t>(&local_1f0,&local_210);
  local_1c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  std::__cxx11::u8string::~u8string((u8string *)&local_210);
  std::__cxx11::u32string::~u32string((u32string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_1c8,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(local_220,local_218);
    testing::internal::AssertHelper::~AssertHelper(local_220);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_278,(jessilib *)L"ABcd",in_string_06);
  jessilib::string_cast<char8_t,char32_t[5]>(&local_298,(jessilib *)L"abCD",in_string_07);
  bVar1 = jessilib::equals<char32_t,char8_t>(&local_278,&local_298);
  local_251 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  std::__cxx11::u8string::~u8string((u8string *)&local_298);
  std::__cxx11::u32string::~u32string((u32string *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_2c8,local_250,
               "equals(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, equals) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(equals(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}